

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O1

void __thiscall DHUDMessage::ResetText(DHUDMessage *this,char *text)

{
  int iVar1;
  int iVar2;
  FBrokenLines *pFVar3;
  int iVar4;
  int iVar5;
  
  if (this->HUDWidth == 0) {
    iVar1 = active_con_scaletext();
    iVar4 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar2 = CleanXfac;
    if (iVar1 != 0) {
      iVar2 = active_con_scaletext();
    }
    iVar4 = iVar4 / iVar2;
  }
  else {
    iVar4 = this->HUDWidth;
    if (this->WrapWidth != 0) {
      iVar4 = this->WrapWidth;
    }
  }
  if (this->Lines != (FBrokenLines *)0x0) {
    V_FreeBrokenLines(this->Lines);
  }
  if (this->NoWrap != false) {
    iVar4 = 0x7fffffff;
  }
  pFVar3 = V_BreakLines(this->Font,iVar4,(BYTE *)text,false);
  this->Lines = pFVar3;
  this->NumLines = 0;
  this->Width = 0;
  this->Height = 0;
  if (pFVar3 != (FBrokenLines *)0x0) {
    iVar4 = this->NumLines;
    iVar2 = pFVar3[iVar4].Width;
    if (-1 < iVar2) {
      iVar1 = this->Width;
      iVar5 = this->Height;
      pFVar3 = pFVar3 + iVar4;
      do {
        pFVar3 = pFVar3 + 1;
        iVar5 = iVar5 + this->Font->FontHeight;
        if (iVar2 < iVar1) {
          iVar2 = iVar1;
        }
        iVar1 = iVar2;
        iVar2 = pFVar3->Width;
        iVar4 = iVar4 + 1;
      } while (-1 < iVar2);
      this->Height = iVar5;
      this->Width = iVar1;
      this->NumLines = iVar4;
    }
  }
  return;
}

Assistant:

void DHUDMessage::ResetText (const char *text)
{
	int width;

	if (HUDWidth != 0)
	{
		width = WrapWidth == 0 ? HUDWidth : WrapWidth;
	}
	else
	{
		switch (active_con_scaletext())
		{
		case 0: width = SCREENWIDTH / CleanXfac; break;
		default: width = SCREENWIDTH / active_con_scaletext(); break;
		}
	}

	if (Lines != NULL)
	{
		V_FreeBrokenLines (Lines);
	}

	Lines = V_BreakLines (Font, NoWrap ? INT_MAX : width, (BYTE *)text);

	NumLines = 0;
	Width = 0;
	Height = 0;

	if (Lines)
	{
		for (; Lines[NumLines].Width >= 0; NumLines++)
		{
			Height += Font->GetHeight ();
			Width = MAX<int> (Width, Lines[NumLines].Width);
		}
	}
}